

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O3

OutputFile * __thiscall re2c::OutputFile::wline_info(OutputFile *this,uint32_t l,char *fn)

{
  output_line_info((ostream *)
                   &((this->blocks).
                     super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1]->fragments).
                    super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]->stream,l,fn);
  return this;
}

Assistant:

OutputFile & OutputFile::wline_info (uint32_t l, const char * fn)
{
	output_line_info (stream (), l, fn);
	return *this;
}